

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.hpp
# Opt level: O2

void __thiscall
PrintTuple<CodegenC::Type,_CodegenC::Type,_CodegenC::Type,_CodegenC::Type,_CodegenC::Type,_CodegenC::Type,_CodegenC::Type>
::print_formatted(PrintTuple<CodegenC::Type,_CodegenC::Type,_CodegenC::Type,_CodegenC::Type,_CodegenC::Type,_CodegenC::Type,_CodegenC::Type>
                  *this,Printer *p,char *s)

{
  char c;
  char *s_00;
  
  do {
    c = *s;
    if (c == '%') {
      s_00 = s + 1;
      if (s[1] != '%') {
        CodegenC::Type::print(this->t0,p);
        PrintTuple<CodegenC::Type,_CodegenC::Type,_CodegenC::Type,_CodegenC::Type,_CodegenC::Type,_CodegenC::Type>
        ::print_formatted(&this->t,p,s_00);
        return;
      }
    }
    else {
      s_00 = s;
      if (c == '\0') {
        return;
      }
    }
    Printer::print(p,c);
    s = s_00 + 1;
  } while( true );
}

Assistant:

void print_formatted(const Printer& p, const char* s) const {
		while (*s) {
			if (*s == '%') {
				++s;
				if (*s != '%') {
					p.print(t0);
					t.print_formatted(p, s);
					return;
				}
			}
			p.print(*s);
			++s;
		}
	}